

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialModule.cpp
# Opt level: O3

void __thiscall module::SequentialModule::~SequentialModule(SequentialModule *this)

{
  Layer *pLVar1;
  pointer ppLVar2;
  pointer ppLVar3;
  ulong uVar4;
  
  this->_vptr_SequentialModule = (_func_int **)&PTR__SequentialModule_00108d38;
  if (this->_in != (tensor)0x0) {
    type::destroyTensor(this->_in);
  }
  ppLVar3 = (this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar2 != ppLVar3) {
    uVar4 = 0;
    do {
      pLVar1 = ppLVar3[uVar4];
      if (pLVar1 != (Layer *)0x0) {
        (*pLVar1->_vptr_Layer[1])(pLVar1);
        ppLVar3 = (this->_lLayers).
                  super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppLVar2 = (this->_lLayers).
                  super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)ppLVar2 - (long)ppLVar3 >> 3));
  }
  if (ppLVar3 != (pointer)0x0) {
    operator_delete(ppLVar3,(long)(this->_lLayers).
                                  super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar3
                   );
    return;
  }
  return;
}

Assistant:

SequentialModule::~SequentialModule()
    {
        if(_in != nullptr) type::destroyTensor(_in);

        for(int i(0); i < _lLayers.size(); i++)
            delete _lLayers[i];
    }